

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O2

bool __thiscall
FillableSigningProvider::AddCScript(FillableSigningProvider *this,CScript *redeemScript)

{
  uint uVar1;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *this_00;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock4;
  CScriptID local_34;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (redeemScript->super_CScriptBase)._size;
  if (uVar1 < 0x226) {
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock4,&this->cs_KeyStore,"cs_KeyStore",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/signingprovider.cpp"
               ,0xa5,false);
    CScriptID::CScriptID(&local_34,redeemScript);
    this_00 = &std::
               map<CScriptID,_CScript,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
               ::operator[](&this->mapScripts,&local_34)->super_CScriptBase;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (this_00,&redeemScript->super_CScriptBase);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock4.super_unique_lock);
  }
  else {
    logging_function._M_str = "AddCScript";
    logging_function._M_len = 10;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/script/signingprovider.cpp"
    ;
    source_file._M_len = 0x6a;
    LogPrintFormatInternal<unsigned_int>
              (logging_function,source_file,0xa1,ALL,Error,(ConstevalFormatString<1U>)0x425de9,
               &MAX_SCRIPT_ELEMENT_SIZE);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return uVar1 < 0x226;
  }
  __stack_chk_fail();
}

Assistant:

bool FillableSigningProvider::AddCScript(const CScript& redeemScript)
{
    if (redeemScript.size() > MAX_SCRIPT_ELEMENT_SIZE) {
        LogError("FillableSigningProvider::AddCScript(): redeemScripts > %i bytes are invalid\n", MAX_SCRIPT_ELEMENT_SIZE);
        return false;
    }

    LOCK(cs_KeyStore);
    mapScripts[CScriptID(redeemScript)] = redeemScript;
    return true;
}